

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  char cVar1;
  undefined1 uVar2;
  float_specs fVar3;
  byte bVar4;
  int iVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  appender aVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int iVar12;
  undefined8 uVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  char *significand;
  anon_class_40_8_dbbf3351 write;
  int num_zeros;
  undefined1 local_d7 [2];
  undefined1 local_d5 [13];
  int local_c8;
  int local_c4;
  float_specs local_c0;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  float_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (float_specs)f->significand;
  local_c8 = f->significand_size;
  local_d5[0] = '0';
  local_d5._9_4_ = fspecs._4_4_;
  local_d7[1] = fspecs._5_1_;
  fVar3 = fspecs;
  if (local_c8 < 0) {
LAB_0010f7d6:
    local_d5._5_8_ = fVar3;
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
                ,0x189,"negative value");
  }
  uVar17 = (ulong)((local_c8 + 1) - (uint)(local_d7[1] == 0));
  local_d7[0] = '.';
  uVar14 = (uint)local_d5._9_4_ >> 0x11;
  local_d5._5_8_ = fspecs;
  if ((uVar14 & 1) != 0) {
    local_d7[0] = decimal_point_impl<char>(loc);
  }
  uVar8 = auStack_a4._4_8_;
  uVar14 = f->exponent;
  local_c4 = local_c8 + uVar14;
  if (SUB81(local_d5._5_8_,4) == '\x01') {
LAB_0010f484:
    iVar12 = local_c8 + uVar14 + -1;
    if (((uint)local_d5._9_4_ >> 0x13 & 1) == 0) {
      uVar10 = 0;
      if (local_c8 == 1) {
        local_d7[0] = '\0';
      }
    }
    else {
      uVar10 = 0;
      if (0 < local_d5._5_4_ - local_c8) {
        uVar10 = (ulong)(uint)(local_d5._5_4_ - local_c8);
      }
      uVar17 = uVar17 + uVar10;
    }
    local_b8[0] = local_d7[1];
    local_b8._8_8_ = local_c0;
    auStack_a4[0] = local_d7[0];
    local_b8._16_4_ = local_c8;
    auStack_a4._4_5_ = CONCAT14('0',(int)uVar10);
    auStack_a4._10_2_ = SUB82(uVar8,6);
    auStack_a4._4_8_ =
         CONCAT26(auStack_a4._10_2_,
                  CONCAT15((((uint)local_d5._9_4_ >> 0x10 & 1) == 0) << 5,auStack_a4._4_5_)) |
         0x450000000000;
    auStack_a4._12_4_ = iVar12;
    if (0 < specs->width) {
      if (local_c4 < 1) {
        iVar12 = 1 - local_c4;
      }
      lVar15 = 2;
      if (99 < iVar12) {
        lVar15 = (ulong)(999 < iVar12) + 3;
      }
      sVar16 = uVar17 + (3 - (ulong)(local_d7[0] == '\0')) + lVar15;
      aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,sVar16,sVar16,(anon_class_40_8_dbbf3351 *)local_b8);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((ulong)(byte)local_d7[1] != 0) {
      cVar1 = ""[(byte)local_d7[1]];
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container + 0x10);
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) = lVar15 + 1;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar15) = cVar1;
    }
    bVar6.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,char>
                   (out,(char *)local_b8._8_8_,local_b8._16_4_,1,auStack_a4[0]);
    if (0 < (int)auStack_a4._4_4_) {
      bVar6.container =
           (buffer<char> *)
           fill_n<fmt::v10::appender,int,char>
                     ((appender)bVar6.container,auStack_a4._4_4_,auStack_a4 + 8);
    }
    uVar2 = auStack_a4[9];
    if ((bVar6.container)->capacity_ < (bVar6.container)->size_ + 1) {
      (**(bVar6.container)->_vptr_buffer)(bVar6.container);
    }
    sVar16 = (bVar6.container)->size_;
    (bVar6.container)->size_ = sVar16 + 1;
    (bVar6.container)->ptr_[sVar16] = uVar2;
    aVar7 = write_exponent<char,fmt::v10::appender>(auStack_a4._12_4_,(appender)bVar6.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  if ((local_d5._5_8_ & 0xff00000000) == 0) {
    iVar12 = 0x10;
    if (0 < (int)local_d5._5_4_) {
      iVar12 = local_d5._5_4_;
    }
    if ((local_c4 < -3) || (iVar12 < local_c4)) goto LAB_0010f484;
  }
  if ((int)uVar14 < 0) {
    if (local_c4 < 1) {
      iVar5 = -local_c4;
      iVar12 = iVar5;
      if (SBORROW4(local_d5._5_4_,iVar5) != local_d5._5_4_ + local_c4 < 0) {
        iVar12 = local_d5._5_4_;
      }
      if ((int)local_d5._5_4_ < 0) {
        iVar12 = iVar5;
      }
      if (local_c8 != 0) {
        iVar12 = iVar5;
      }
      local_70._M_allocated_capacity._0_4_ = iVar12;
      bVar4 = 1;
      if (local_c8 == 0 && iVar12 == 0) {
        bVar4 = (local_d5[0xb] & 8) >> 3;
      }
      local_d5[1] = bVar4;
      fVar3 = (float_specs)local_d5._5_8_;
      if (-1 < iVar12) {
        sVar16 = ((uint)bVar4 + iVar12 + 1) + uVar17;
        local_b8._0_8_ = local_d7 + 1;
        local_b8._8_8_ = local_d7 + 2;
        unique0x00004e80 = local_d7 + 3;
        auStack_a4._4_8_ = local_d7;
        auStack_a4._12_8_ = &local_70;
        local_90 = &local_c0;
        local_88._M_allocated_capacity = (size_type)&local_c8;
        aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar16,sVar16,(anon_class_56_7_162c6e41 *)local_b8);
        return (appender)
               aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      goto LAB_0010f7d6;
    }
    uVar14 = local_d5._5_4_ - local_c8 & (int)(local_d5._9_4_ << 0xc) >> 0x1f;
    local_d5._1_4_ = uVar14;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)((uint)local_d5._9_4_ >> 0x11) & 1)
              );
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)(int *)local_b8._8_8_ + local_b8._0_8_);
    iVar12 = 0;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    sVar16 = uVar14 + uVar17;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b8._0_8_;
    do {
      iVar5 = 0x7fffffff;
      if (local_90 != (float_specs *)0x0) {
        if (paVar9 == paVar11) {
          uVar14 = (uint)paVar11->_M_local_buf[-1];
        }
        else {
          bVar4 = paVar9->_M_local_buf[0];
          if ((byte)(bVar4 + 0x81) < 0x82) goto LAB_0010f68e;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar9->_M_local_buf + 1);
          uVar14 = (uint)bVar4;
        }
        iVar12 = iVar12 + uVar14;
        iVar5 = iVar12;
      }
LAB_0010f68e:
      sVar16 = sVar16 + 1;
    } while (iVar5 < local_c4);
    local_70._M_allocated_capacity = (size_type)(local_d7 + 1);
    local_70._8_8_ = &local_c0;
    local_60._M_allocated_capacity = (size_type)&local_c8;
    local_60._8_8_ = &local_c4;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d7;
    local_40._M_allocated_capacity = (size_type)(local_d7 + 3);
    local_40._8_8_ = local_d7 + 2;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar6.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                   (out,specs,sVar16,sVar16,(anon_class_64_8_e6ffa566 *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar8 = stack0xffffffffffffff58;
    uVar13 = local_b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b8 + 0x10)) {
      return (appender)bVar6.container;
    }
  }
  else {
    lVar15 = uVar14 + uVar17;
    local_d5._1_4_ = local_d5._5_4_ - local_c4;
    if (((uint)local_d5._9_4_ >> 0x13 & 1) != 0) {
      if (SUB81(local_d5._5_8_,4) != '\x02' && (int)local_d5._1_4_ < 1) {
        local_d5._1_4_ = 0;
      }
      lVar15 = lVar15 + 1;
      if (0 < (long)(int)local_d5._1_4_) {
        lVar15 = lVar15 + (int)local_d5._1_4_;
      }
    }
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&local_70,loc,
               (bool)((byte)((uint)local_d5._9_4_ >> 0x11) & 1));
    sVar16 = lVar15 - 1;
    iVar12 = 0;
    uVar8 = local_70._0_8_;
    do {
      iVar5 = 0x7fffffff;
      if (local_48 != (digit_grouping<char> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_70._8_8_ + local_70._M_allocated_capacity)) {
          uVar14 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_70._8_8_ + local_70._M_allocated_capacity))->_M_local_buf[-1];
        }
        else {
          bVar4 = *(byte *)uVar8;
          if ((byte)(bVar4 + 0x81) < 0x82) goto LAB_0010f3e0;
          uVar8 = uVar8 + 1;
          uVar14 = (uint)bVar4;
        }
        iVar12 = iVar12 + uVar14;
        iVar5 = iVar12;
      }
LAB_0010f3e0:
      sVar16 = sVar16 + 1;
    } while (iVar5 < local_c4);
    local_b8._0_8_ = local_d7 + 1;
    local_b8._8_8_ = &local_c0;
    unique0x00004e80 = &local_c8;
    local_90 = (float_specs *)(local_d7 + 7);
    local_88._M_allocated_capacity = (size_type)local_d7;
    local_88._8_8_ = local_d7 + 3;
    local_78 = local_d7 + 2;
    auStack_a4._4_8_ = f;
    auStack_a4._12_8_ = &local_70;
    bVar6.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                   (out,specs,sVar16,sVar16,(anon_class_72_9_0c6a3a8a *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar8 = local_60._M_allocated_capacity;
    uVar13 = local_70._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ == &local_60) {
      return (appender)bVar6.container;
    }
  }
  operator_delete((void *)uVar13,uVar8 + 1);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}